

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

string * tyhp_time_gmt_abi_cxx11_(void)

{
  tm *ptVar1;
  size_t sVar2;
  string *in_RDI;
  char buf [16];
  time_t now;
  long *local_68 [2];
  long local_58 [2];
  char local_48 [16];
  time_t local_38;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  time(&local_38);
  ptVar1 = localtime(&local_38);
  if ((uint)ptVar1->tm_wday < 7) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  snprintf(local_48,0x10,"%d ",(ulong)(uint)ptVar1->tm_mday);
  local_68[0] = local_58;
  sVar2 = strlen(local_48);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_48,local_48 + sVar2);
  std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_68[0]);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((uint)ptVar1->tm_mon < 0xc) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  snprintf(local_48,0x10,"%d",(ulong)(ptVar1->tm_year + 0x76c));
  local_68[0] = local_58;
  sVar2 = strlen(local_48);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_48,local_48 + sVar2);
  std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_68[0]);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  snprintf(local_48,0x10," %d:%d:%d ",(ulong)(uint)ptVar1->tm_hour,(ulong)(uint)ptVar1->tm_min,
           (ulong)(uint)ptVar1->tm_sec);
  local_68[0] = local_58;
  sVar2 = strlen(local_48);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_48,local_48 + sVar2);
  std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_68[0]);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

string tyhp_time_gmt()
{
	time_t now;
	struct tm *time_now;
	string str_time;

	time(&now);
	time_now = localtime(&now);

	switch(time_now->tm_wday)
	{
		case 0:
			str_time += "Sun, ";
			break;
		case 1:
			str_time += "Mon, ";
			break;
		case 2:
			str_time += "Tue, ";
			break;
		case 3:
			str_time += "Wed, ";
			break;
		case 4:
			str_time += "Thu, ";
			break;
		case 5:
			str_time += "Fri, ";
			break;
		case 6:
			str_time += "Sat, ";
			break;
	}
	char buf[16];
	snprintf(buf, sizeof(buf), "%d ", time_now->tm_mday);
	str_time += string(buf);
	switch(time_now->tm_mon)
	{
		case 0:
			str_time += "Jan ";
			break;
		case 1:
			str_time += "Feb ";
			break;
		case 2:
			str_time += "Mar ";
			break;
		case 3:
			str_time += "Apr ";
			break;
		case 4:
			str_time += "May ";
			break;
		case 5:
			str_time += "Jun ";
			break;
		case 6:
			str_time += "Jul ";
			break;
		case 7:
			str_time += "Aug ";
			break;
		case 8:
			str_time += "Sep ";
			break;
		case 9:
			str_time += "Oct ";
			break;
		case 10:
			str_time += "Nov ";
			break;
		case 11:
			str_time += "Dec ";
			break;
	}
	snprintf(buf, sizeof(buf), "%d", time_now->tm_year + 1900);
	str_time += string(buf);
	snprintf(buf, sizeof(buf), " %d:%d:%d ", time_now->tm_hour, time_now->tm_min, time_now->tm_sec);
	str_time += string(buf);

	str_time += "GMT";

	return str_time;
}